

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

Instruction * __thiscall
spvtools::opt::Instruction::InsertBefore
          (Instruction *this,
          unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
          *inst)

{
  pointer pIVar1;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  *inst_local;
  Instruction *this_local;
  
  pIVar1 = std::
           unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ::get(inst);
  utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
            (&pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>,this);
  pIVar1 = std::
           unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ::release(inst);
  return pIVar1;
}

Assistant:

Instruction* Instruction::InsertBefore(std::unique_ptr<Instruction>&& inst) {
  inst.get()->InsertBefore(this);
  return inst.release();
}